

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error FT_Stroker_GetCounts(FT_Stroker stroker,FT_UInt *anum_points,FT_UInt *anum_contours)

{
  FT_Error local_3c;
  FT_UInt local_38;
  FT_Error error;
  FT_UInt num_contours;
  FT_UInt count4;
  FT_UInt count3;
  FT_UInt num_points;
  FT_UInt count2;
  FT_UInt count1;
  FT_UInt *anum_contours_local;
  FT_UInt *anum_points_local;
  FT_Stroker stroker_local;
  
  count4 = 0;
  local_38 = 0;
  _count2 = anum_contours;
  anum_contours_local = anum_points;
  if (stroker == (FT_Stroker)0x0) {
    local_3c = 6;
  }
  else {
    anum_points_local = (FT_UInt *)stroker;
    local_3c = ft_stroke_border_get_counts(stroker->borders,&num_points,&count3);
    if ((local_3c == 0) &&
       (local_3c = ft_stroke_border_get_counts
                             ((FT_StrokeBorder)(anum_points_local + 0x28),&num_contours,
                              (FT_UInt *)&error), local_3c == 0)) {
      count4 = num_points + num_contours;
      local_38 = count3 + error;
    }
  }
  if (anum_contours_local != (FT_UInt *)0x0) {
    *anum_contours_local = count4;
  }
  if (_count2 != (FT_UInt *)0x0) {
    *_count2 = local_38;
  }
  return local_3c;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_GetCounts( FT_Stroker  stroker,
                        FT_UInt    *anum_points,
                        FT_UInt    *anum_contours )
  {
    FT_UInt   count1, count2, num_points   = 0;
    FT_UInt   count3, count4, num_contours = 0;
    FT_Error  error;


    if ( !stroker )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    error = ft_stroke_border_get_counts( stroker->borders + 0,
                                         &count1, &count2 );
    if ( error )
      goto Exit;

    error = ft_stroke_border_get_counts( stroker->borders + 1,
                                         &count3, &count4 );
    if ( error )
      goto Exit;

    num_points   = count1 + count3;
    num_contours = count2 + count4;

  Exit:
    if ( anum_points )
      *anum_points   = num_points;

    if ( anum_contours )
      *anum_contours = num_contours;

    return error;
  }